

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O2

olsrv2_tc_edge * olsrv2_tc_edge_add(olsrv2_tc_node *src,netaddr *addr)

{
  long lVar1;
  olsrv2_tc_edge *ptr;
  olsrv2_tc_edge *poVar2;
  long lVar3;
  olsrv2_tc_node *poVar4;
  
  lVar1 = avl_find(&src->_edges);
  ptr = (olsrv2_tc_edge *)(lVar1 + -0x30);
  if (lVar1 == 0) {
    ptr = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
    if (ptr != (olsrv2_tc_edge *)0x0) {
      poVar2 = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
      if (poVar2 != (olsrv2_tc_edge *)0x0) {
        lVar1 = avl_find(&_tc_tree);
        if (lVar1 == 0) {
          poVar4 = olsrv2_tc_node_add(addr,0,0);
          if (poVar4 == (olsrv2_tc_node *)0x0) {
            oonf_class_free(&_tc_edge_class,ptr);
            ptr = poVar2;
            goto LAB_0013266e;
          }
        }
        else {
          poVar4 = (olsrv2_tc_node *)(lVar1 + -0x150);
        }
        ptr->src = src;
        ptr->dst = poVar4;
        ptr->inverse = poVar2;
        for (lVar1 = 6; lVar1 != 10; lVar1 = lVar1 + 1) {
          ptr->cost[lVar1 + -6] = 0xffffff;
        }
        (ptr->_node).key = poVar4;
        avl_insert(&src->_edges,&ptr->_node);
        poVar2->src = poVar4;
        poVar2->dst = src;
        poVar2->inverse = ptr;
        poVar2->virtual = true;
        for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
          poVar2->cost[lVar1] = 0xffffff;
        }
        (poVar2->_node).key = src;
        avl_insert(&poVar4->_edges,&poVar2->_node);
        goto LAB_00132705;
      }
LAB_0013266e:
      oonf_class_free(&_tc_edge_class,ptr);
    }
    ptr = (olsrv2_tc_edge *)0x0;
  }
  else {
    *(undefined1 *)(lVar1 + -6) = 0;
    for (lVar3 = -6; lVar3 != -2; lVar3 = lVar3 + 1) {
      *(undefined4 *)(lVar1 + lVar3 * 4) = 0xffffff;
    }
LAB_00132705:
    oonf_class_event(&_tc_edge_class,ptr,OONF_OBJECT_ADDED);
  }
  return ptr;
}

Assistant:

struct olsrv2_tc_edge *
olsrv2_tc_edge_add(struct olsrv2_tc_node *src, struct netaddr *addr) {
  struct olsrv2_tc_edge *edge = NULL, *inverse = NULL;
  struct olsrv2_tc_node *dst = NULL;
  int i;

  edge = avl_find_element(&src->_edges, addr, edge, _node);
  if (edge != NULL) {
    edge->virtual = false;

    /* cleanup metric data from other side of the edge */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      edge->cost[i] = RFC7181_METRIC_INFINITE;
    }

    /* fire event */
    oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
    return edge;
  }

  /* allocate edge */
  edge = oonf_class_malloc(&_tc_edge_class);
  if (edge == NULL) {
    return NULL;
  }

  /* allocate inverse edge */
  inverse = oonf_class_malloc(&_tc_edge_class);
  if (inverse == NULL) {
    oonf_class_free(&_tc_edge_class, edge);
    return NULL;
  }

  /* find or allocate destination node */
  dst = avl_find_element(&_tc_tree, addr, dst, _originator_node);
  if (dst == NULL) {
    /* create virtual node */
    dst = olsrv2_tc_node_add(addr, 0, 0);
    if (dst == NULL) {
      oonf_class_free(&_tc_edge_class, edge);
      oonf_class_free(&_tc_edge_class, inverse);
      return NULL;
    }
  }

  /* initialize edge */
  edge->src = src;
  edge->dst = dst;
  edge->inverse = inverse;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    edge->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook edge into src node */
  edge->_node.key = &dst->target.prefix.dst;
  avl_insert(&src->_edges, &edge->_node);

  /* initialize inverse (virtual) edge */
  inverse->src = dst;
  inverse->dst = src;
  inverse->inverse = edge;
  inverse->virtual = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    inverse->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook inverse edge into dst node */
  inverse->_node.key = &src->target.prefix.dst;
  avl_insert(&dst->_edges, &inverse->_node);

  /* fire event */
  oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
  return edge;
}